

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexem.cpp
# Opt level: O1

int __thiscall Hpipe::Lexem::display_dot(Lexem *this,char *f,char *prg)

{
  int iVar1;
  ostream *poVar2;
  StreamSep *this_00;
  int iVar3;
  StreamSepMaker os;
  ofstream of;
  string local_3f0;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0 [3];
  string local_388;
  string local_368;
  StreamSepMaker local_348;
  StreamSep local_2c0;
  StreamSep local_278;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,f,_S_out);
  local_3d0._8_8_ = (char *)0x0;
  local_3c0[0]._M_local_buf[0] = '\0';
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3d0._0_8_ = (ostream *)(local_3d0 + 0x10);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"\n","");
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  StreamSepMaker::StreamSepMaker
            (&local_348,(TS *)&local_230,(string *)local_3d0,&local_368,&local_3f0,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,
                    CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                             local_368.field_2._M_local_buf[0]) + 1);
  }
  if ((ostream *)local_3d0._0_8_ != (ostream *)(local_3d0 + 0x10)) {
    operator_delete((void *)local_3d0._0_8_,
                    CONCAT71(local_3c0[0]._M_allocated_capacity._1_7_,local_3c0[0]._M_local_buf[0])
                    + 1);
  }
  StreamSepMaker::operator<<(&local_278,&local_348,(char (*) [21])"digraph LexemMaker {");
  StreamSep::~StreamSep(&local_278);
  iVar1 = write_dot(this,&local_348,0);
  if (-1 < iVar1) {
    iVar3 = 0;
    do {
      StreamSepMaker::operator<<((StreamSep *)local_3d0,&local_348,(char (*) [3])0x17c2f6);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3d0._0_8_,(char *)local_3d0._8_8_,
                          CONCAT71(local_3c0[0]._M_allocated_capacity._1_7_,
                                   local_3c0[0]._M_local_buf[0]));
      std::ostream::operator<<((ostream *)poVar2,iVar3);
      StreamSep::operator<<((StreamSep *)local_3d0,(char (*) [22])" [ shape=plaintext ];");
      StreamSep::~StreamSep((StreamSep *)local_3d0);
      if (iVar3 != 0) {
        StreamSepMaker::operator<<((StreamSep *)local_3d0,&local_348,(char (*) [3])0x17c2f6);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3d0._0_8_,(char *)local_3d0._8_8_,
                            CONCAT71(local_3c0[0]._M_allocated_capacity._1_7_,
                                     local_3c0[0]._M_local_buf[0]));
        std::ostream::operator<<((ostream *)poVar2,iVar3 + -1);
        this_00 = StreamSep::operator<<((StreamSep *)local_3d0,(char (*) [5])0x17db27);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (this_00->stream,(this_00->sep)._M_dataplus._M_p,
                            (this_00->sep)._M_string_length);
        std::ostream::operator<<((ostream *)poVar2,iVar3);
        StreamSep::operator<<(this_00,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_3d0);
      }
      iVar3 = iVar3 + 1;
    } while (iVar1 + 1 != iVar3);
  }
  StreamSepMaker::operator<<(&local_2c0,&local_348,(char (*) [2])0x17e0da);
  StreamSep::~StreamSep(&local_2c0);
  std::ofstream::close();
  iVar1 = exec_dot(f,prg,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.end._M_dataplus._M_p != &local_348.end.field_2) {
    operator_delete(local_348.end._M_dataplus._M_p,local_348.end.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.sep._M_dataplus._M_p != &local_348.sep.field_2) {
    operator_delete(local_348.sep._M_dataplus._M_p,local_348.sep.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.beg._M_dataplus._M_p != &local_348.beg.field_2) {
    operator_delete(local_348.beg._M_dataplus._M_p,local_348.beg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.first_beg._M_dataplus._M_p != &local_348.first_beg.field_2) {
    operator_delete(local_348.first_beg._M_dataplus._M_p,
                    local_348.first_beg.field_2._M_allocated_capacity + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar1;
}

Assistant:

int Lexem::display_dot( const char *f, const char *prg ) const {
    std::ofstream of( f );
    StreamSepMaker os( of );
    os << "digraph LexemMaker {";

    int m = write_dot( os, 0 );

    for( int i = 0; i <= m; ++i ) {
        os << "  " << i << " [ shape=plaintext ];";
        if ( i )
            os << "  " << i - 1 << " -> " << i << ";";
    }

    os << "}";
    of.close();

    return exec_dot( f, prg );
}